

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O0

void __thiscall
ConditionalEstimator::setParameter(ConditionalEstimator *this,Property *p,double value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double **ppdVar4;
  double *pdVar5;
  int iVar6;
  int local_2c;
  int local_28;
  int i_1;
  int i;
  int size;
  double value_local;
  Property *p_local;
  ConditionalEstimator *this_local;
  
  if (*p == 1) {
    this->aDistRange[0] = value;
  }
  else if (*p == 2) {
    this->aDistRange[1] = value;
  }
  else {
    if (*p != 3) {
      return;
    }
    this->nDist = (int)value;
  }
  iVar6 = this->nPre + this->nPost + 1;
  if (this->aDist != (double **)0x0) {
    for (local_28 = 0; local_28 < iVar6; local_28 = local_28 + 1) {
      if ((this->aDist[local_28] != (double *)0x0) && (this->aDist[local_28] != (double *)0x0)) {
        operator_delete__(this->aDist[local_28]);
      }
    }
    if (this->aDist != (double **)0x0) {
      operator_delete__(this->aDist);
    }
  }
  this->dDistOffset = this->aDistRange[0];
  this->dDistScale = (this->aDistRange[1] - this->aDistRange[0]) / (double)this->nDist;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar6;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppdVar4 = (double **)operator_new__(uVar3);
  this->aDist = ppdVar4;
  for (local_2c = 0; local_2c < iVar6; local_2c = local_2c + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)this->nDist;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar5 = (double *)operator_new__(uVar3);
    this->aDist[local_2c] = pdVar5;
  }
  return;
}

Assistant:

void ConditionalEstimator::setParameter( const Property& p, double value )
{
	// assign parameter
	if (p==EST_DIST_MIN)
		aDistRange[0] = value;
	else if (p==EST_DIST_MAX)
		aDistRange[1] = value;
	else if (p==EST_DIST_BINS)
		nDist = (int)value;
	else return;
	
	// re-generate distribution
	int size = nPre+nPost+1;
	if (aDist) {
		for( int i=0; i<size; i++ )
			if (aDist[i])
				delete[] aDist[i];
		delete[] aDist;
	}
	dDistOffset = double(aDistRange[0]);
	dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	aDist = new double *[size];
	for( int i=0; i<size; i++ )
		aDist[i] = new double[nDist];
}